

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayNewElem * __thiscall
wasm::Builder::makeArrayNewElem
          (Builder *this,HeapType type,Name seg,Expression *offset,Expression *size)

{
  Type local_48;
  ArrayNewElem *local_40;
  ArrayNewElem *ret;
  Expression *size_local;
  Expression *offset_local;
  Builder *this_local;
  Name seg_local;
  HeapType type_local;
  
  seg_local.super_IString.str._M_len = seg.super_IString.str._M_str;
  this_local = seg.super_IString.str._M_len;
  ret = (ArrayNewElem *)size;
  size_local = offset;
  offset_local = (Expression *)this;
  seg_local.super_IString.str._M_str = (char *)type.id;
  local_40 = MixedArena::alloc<wasm::ArrayNewElem>(&this->wasm->allocator);
  wasm::Name::operator=(&local_40->segment,(Name *)&this_local);
  local_40->offset = size_local;
  local_40->size = (Expression *)ret;
  wasm::Type::Type(&local_48,(HeapType)seg_local.super_IString.str._M_str,NonNullable,Inexact);
  (local_40->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id =
       local_48.id;
  ArrayNewElem::finalize(local_40);
  return local_40;
}

Assistant:

ArrayNewElem* makeArrayNewElem(HeapType type,
                                 Name seg,
                                 Expression* offset,
                                 Expression* size) {
    auto* ret = wasm.allocator.alloc<ArrayNewElem>();
    ret->segment = seg;
    ret->offset = offset;
    ret->size = size;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }